

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyJointLimitConstraint.cpp
# Opt level: O0

int __thiscall btMultiBodyJointLimitConstraint::getIslandIdB(btMultiBodyJointLimitConstraint *this)

{
  int iVar1;
  int iVar2;
  btCollisionObject *this_00;
  btMultibodyLink *pbVar3;
  long in_RDI;
  int i;
  btMultiBodyLinkCollider *col;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int local_1c;
  
  if (*(long *)(in_RDI + 0x10) != 0) {
    this_00 = (btCollisionObject *)btMultiBody::getBaseCollider(*(btMultiBody **)(in_RDI + 0x10));
    if (this_00 != (btCollisionObject *)0x0) {
      iVar1 = btCollisionObject::getIslandTag(this_00);
      return iVar1;
    }
    local_1c = 0;
    while (iVar1 = local_1c, iVar2 = btMultiBody::getNumLinks((btMultiBody *)0x253737),
          iVar1 < iVar2) {
      pbVar3 = btMultiBody::getLink
                         ((btMultiBody *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffcc);
      if ((btCollisionObject *)pbVar3->m_collider != (btCollisionObject *)0x0) {
        iVar1 = btCollisionObject::getIslandTag((btCollisionObject *)pbVar3->m_collider);
        return iVar1;
      }
      local_1c = local_1c + 1;
    }
  }
  return -1;
}

Assistant:

int btMultiBodyJointLimitConstraint::getIslandIdB() const
{
	if(m_bodyB)
	{
		btMultiBodyLinkCollider* col = m_bodyB->getBaseCollider();
		if (col)
			return col->getIslandTag();

		for (int i=0;i<m_bodyB->getNumLinks();i++)
		{
			col = m_bodyB->getLink(i).m_collider;
			if (col)
				return col->getIslandTag();
		}
	}
	return -1;
}